

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QOpenFolderButton.cpp
# Opt level: O2

void QOpenFolderButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QString *directory;
  Int *pIVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  Options OVar5;
  QOpenFolderButton *_t;
  QArrayDataPointer<char16_t> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 0) {
      filePathChanged((QOpenFolderButton *)_o,(QString *)_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if ((uint)_id < 4) {
      pIVar1 = (Int *)*_a;
      switch(_id) {
      case 0:
        filePath((QString *)&local_28,(QOpenFolderButton *)_o);
        break;
      case 1:
        caption((QString *)&local_28,(QOpenFolderButton *)_o);
        break;
      case 2:
        QOpenFolderButton::directory((QString *)&local_28,(QOpenFolderButton *)_o);
        break;
      case 3:
        OVar5 = options((QOpenFolderButton *)_o);
        *pIVar1 = OVar5.i;
        return;
      }
      pDVar3 = *(Data **)pIVar1;
      pcVar4 = *(char16_t **)(pIVar1 + 2);
      *(Data **)pIVar1 = local_28.d;
      *(char16_t **)(pIVar1 + 2) = local_28.ptr;
      qVar2 = *(qsizetype *)(pIVar1 + 4);
      *(qsizetype *)(pIVar1 + 4) = local_28.size;
      local_28.d = pDVar3;
      local_28.ptr = pcVar4;
      local_28.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      directory = (QString *)*_a;
      switch(_id) {
      case 0:
        setFilePath((QOpenFolderButton *)_o,directory);
        return;
      case 1:
        setCaption((QOpenFolderButton *)_o,directory);
        return;
      case 2:
        setDirectory((QOpenFolderButton *)_o,directory);
        return;
      case 3:
        setOptions((QOpenFolderButton *)_o,(Options)*(Int *)&(directory->d).d);
        return;
      }
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == filePathChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  return;
}

Assistant:

void QOpenFolderButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QOpenFolderButton *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QOpenFolderButton::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QOpenFolderButton::filePathChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QOpenFolderButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->filePath(); break;
        case 1: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->directory(); break;
        case 3: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QOpenFolderButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFilePath(*reinterpret_cast< QString*>(_v)); break;
        case 1: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 2: _t->setDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}